

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::StringOption::printOptionCall(StringOption *this,stringstream *s)

{
  string *psVar1;
  size_t sVar2;
  size_type sVar3;
  ostream *poVar4;
  char *pcVar5;
  
  psVar1 = this->value;
  poVar4 = (ostream *)(s + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
  pcVar5 = (this->super_Option).name;
  if (psVar1 == (string *)0x0) {
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar2 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar2);
    }
    pcVar5 = "=\"\"";
    sVar3 = 3;
  }
  else {
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar2 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=",1);
    pcVar5 = (this->value->_M_dataplus)._M_p;
    sVar3 = this->value->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar3);
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s)
    {
        if (value != NULL) {
            s << "-" << name << "=" << *value;
        } else {
            s << "-" << name << "=\"\"";
        }
    }